

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.cpp
# Opt level: O2

uint __thiscall Kernel::Signature::getApp(Signature *this)

{
  Symbol *pSVar1;
  uint uVar2;
  OperatorType *pOVar3;
  uint in_R8D;
  initializer_list<Kernel::TermList> sorts;
  bool added;
  allocator<char> local_41;
  string local_40;
  
  added = false;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"vAPP",&local_41);
  uVar2 = addFunction(this,&local_40,4,&added);
  std::__cxx11::string::~string((string *)&local_40);
  if (added == true) {
    this->_appFun = uVar2;
    local_40._M_dataplus._M_p = (pointer)AtomicSort::arrowSort((TermList)0x1,(TermList)0x5);
    local_40._M_string_length = 1;
    sorts._M_len = 5;
    sorts._M_array = (iterator)0x2;
    pOVar3 = OperatorType::getFunctionType((OperatorType *)&local_40,sorts,(TermList)0x2,in_R8D);
    pSVar1 = (this->_funs)._stack[uVar2];
    pSVar1->_typeArgsArity = pOVar3->_typeArgsArity;
    pSVar1->_type = pOVar3;
  }
  return uVar2;
}

Assistant:

unsigned Signature::getApp()
{
  bool added = false;
  unsigned app = addFunction("vAPP", 4, added);
  if(added){
    _appFun = app;
    TermList tv1 = TermList(0, false);
    TermList tv2 = TermList(1, false);
    TermList arrowType = AtomicSort::arrowSort(tv1, tv2);
    OperatorType* ot = OperatorType::getFunctionType({arrowType, tv1}, tv2, 2);
    Symbol* sym = getFunction(app);
    sym->setType(ot);
  }
  return app;
}